

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amrex_parser.tab.cpp
# Opt level: O0

int amrex_parserparse(void)

{
  char cVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  amrex_parsersymbol_kind_t aVar5;
  char *__n;
  char *__dest;
  AMREX_PARSERSTYPE *__dest_00;
  parser_node *nl;
  int yyi;
  int yylhs;
  long yynewbytes_1;
  long yynewbytes;
  amrex_parseralloc *yyptr;
  yy_state_t *yyss1;
  long yysize;
  int yylen;
  AMREX_PARSERSTYPE yyval;
  amrex_parsersymbol_kind_t yytoken;
  int yyresult;
  int yyn;
  AMREX_PARSERSTYPE *yyvsp;
  AMREX_PARSERSTYPE *yyvs;
  AMREX_PARSERSTYPE yyvsa [200];
  yy_state_t *yyssp;
  yy_state_t *yyss;
  yy_state_t yyssa [200];
  long yystacksize;
  int yyerrstatus;
  yy_state_fast_t yystate;
  undefined4 in_stack_fffffffffffff858;
  amrex_parsersymbol_kind_t in_stack_fffffffffffff85c;
  amrex_parsersymbol_kind_t in_stack_fffffffffffff860;
  parser_f1_t in_stack_fffffffffffff864;
  parser_f3_t in_stack_fffffffffffff874;
  AMREX_PARSERSTYPE local_750;
  parser_f3_t local_744;
  int local_740;
  int local_73c;
  AMREX_PARSERSTYPE *local_738;
  AMREX_PARSERSTYPE *local_730;
  AMREX_PARSERSTYPE local_728 [77];
  char *local_e8;
  char *local_e0;
  char local_d8 [200];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = 0;
  local_10 = 200;
  local_e8 = local_d8;
  local_738 = local_728;
  amrex_parserchar = -2;
  local_730 = local_738;
  local_e0 = local_e8;
  do {
    *local_e8 = (char)local_4;
    if (local_e0 + local_10 + -1 <= local_e8) {
      __n = local_e8 + (1 - (long)local_e0);
      if (local_10 < 10000) {
        local_10 = local_10 << 1;
        if (10000 < local_10) {
          local_10 = 10000;
        }
        __dest = (char *)malloc(local_10 * 9 + 7);
        if (__dest != (char *)0x0) {
          memcpy(__dest,local_e0,(size_t)__n);
          __dest_00 = (AMREX_PARSERSTYPE *)(__dest + ((local_10 + 7) / 8) * 8);
          memcpy(__dest_00,local_730,(long)__n * 8);
          if (local_e0 != local_d8) {
            free(local_e0);
          }
          local_e8 = __dest + (long)(__n + -1);
          local_738 = __dest_00 + (long)(__n + -1);
          local_730 = __dest_00;
          local_e0 = __dest;
          if (local_e8 < __dest + local_10 + -1) goto LAB_018c9b4a;
LAB_018ca36e:
          local_740 = 1;
          goto LAB_018ca38e;
        }
      }
      amrex_parsererror("memory exhausted");
      local_740 = 2;
      goto LAB_018ca38e;
    }
LAB_018c9b4a:
    if (local_4 == 2) {
      local_740 = 0;
LAB_018ca38e:
      if (amrex_parserchar != -2) {
        if ((amrex_parserchar < 0) || (0x111 < amrex_parserchar)) {
          aVar5 = YYSYMBOL_YYUNDEF;
        }
        else {
          aVar5 = (amrex_parsersymbol_kind_t)""[amrex_parserchar];
        }
        yydestruct("Cleanup: discarding lookahead",aVar5,&amrex_parserlval);
      }
      for (; local_e8 != local_e0; local_e8 = local_e8 + -1) {
        yydestruct("Cleanup: popping",(int)""[(int)*local_e8],local_738);
        local_738 = local_738 + -1;
      }
      if (local_e0 != local_d8) {
        free(local_e0);
      }
      return local_740;
    }
    sVar2 = yypact[local_4];
    if (sVar2 == -0x15) {
LAB_018c9cc3:
      local_73c = (int)"\x02"[local_4];
      if (local_73c == 0) {
        if (amrex_parserchar == -2) {
          aVar5 = YYSYMBOL_YYEMPTY;
        }
        else if ((amrex_parserchar < 0) || (0x111 < amrex_parserchar)) {
          in_stack_fffffffffffff85c = YYSYMBOL_YYUNDEF;
          aVar5 = in_stack_fffffffffffff85c;
        }
        else {
          in_stack_fffffffffffff85c = (amrex_parsersymbol_kind_t)""[amrex_parserchar];
          aVar5 = in_stack_fffffffffffff85c;
        }
        in_stack_fffffffffffff860 = aVar5;
        if (local_8 == 0) {
          amrex_parsernerrs = amrex_parsernerrs + 1;
          amrex_parsererror("syntax error");
        }
        if (local_8 == 3) {
          if (amrex_parserchar < 1) {
            if (amrex_parserchar == 0) goto LAB_018ca36e;
          }
          else {
            yydestruct("Error: discarding",aVar5,&amrex_parserlval);
            amrex_parserchar = -2;
          }
        }
LAB_018ca247:
        local_8 = 3;
        while (((yypact[local_4] == -0x15 || (iVar4 = yypact[local_4] + 1, iVar4 < 0)) ||
               ((0x112 < iVar4 ||
                (("\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
                  [iVar4] != '\x01' ||
                 (cVar1 = "\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02"[iVar4], cVar1 < 1))
                ))))) {
          if (local_e8 == local_e0) goto LAB_018ca36e;
          yydestruct("Error: popping",(int)""[local_4],local_738);
          local_738 = local_738 + -1;
          local_e8 = local_e8 + -1;
          local_4 = (int)*local_e8;
        }
        local_738[1] = amrex_parserlval;
        local_738 = local_738 + 1;
        local_4 = (int)cVar1;
      }
      else {
LAB_018c9ce8:
        iVar4 = (int)""[local_73c];
        local_750 = local_738[1 - iVar4];
        nl = (parser_node *)(ulong)(local_73c - 3);
        switch(nl) {
        case (parser_node *)0x0:
          amrex::parser_defexpr(local_738[-1].n);
          break;
        case (parser_node *)0x1:
          local_750.n = amrex::parser_newnumber
                                  ((double)CONCAT44(in_stack_fffffffffffff864,
                                                    in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x2:
          local_750.n = amrex::parser_newsymbol(local_738->s);
          break;
        case (parser_node *)0x3:
          local_750.n = amrex::parser_newnode
                                  (in_stack_fffffffffffff874,nl,
                                   (parser_node *)
                                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x4:
          local_750.n = amrex::parser_newnode
                                  (in_stack_fffffffffffff874,nl,
                                   (parser_node *)
                                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x5:
          local_750.n = amrex::parser_newnode
                                  (in_stack_fffffffffffff874,nl,
                                   (parser_node *)
                                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x6:
          local_750.n = amrex::parser_newnode
                                  (in_stack_fffffffffffff874,nl,
                                   (parser_node *)
                                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x7:
          local_750 = local_738[-1];
          break;
        case (parser_node *)0x8:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x9:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0xa:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0xb:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0xc:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0xd:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0xe:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0xf:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x10:
          local_750.n = amrex::parser_newnode
                                  (in_stack_fffffffffffff874,nl,
                                   (parser_node *)
                                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x11:
          local_750 = *local_738;
          break;
        case (parser_node *)0x12:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x13:
          local_750.n = amrex::parser_newf1(in_stack_fffffffffffff864,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff85c,
                                                     in_stack_fffffffffffff858));
          break;
        case (parser_node *)0x14:
          local_750.n = amrex::parser_newf2(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860));
          break;
        case (parser_node *)0x15:
          local_750.n = amrex::parser_newf3(in_stack_fffffffffffff874,nl,
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff864,
                                                     in_stack_fffffffffffff860),
                                            (parser_node *)
                                            CONCAT44(in_stack_fffffffffffff85c,
                                                     in_stack_fffffffffffff858));
          break;
        case (parser_node *)0x16:
          local_750.n = amrex::parser_newassign
                                  ((parser_symbol *)
                                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                                   (parser_node *)
                                   CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          break;
        case (parser_node *)0x17:
          local_750.n = amrex::parser_newlist
                                  (nl,(parser_node *)
                                      CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860))
          ;
          break;
        case (parser_node *)0x18:
          local_750.n = amrex::parser_newlist
                                  (nl,(parser_node *)
                                      CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860))
          ;
        }
        local_e8 = local_e8 + -(long)iVar4;
        local_738[1 - (long)iVar4].n = (parser_node *)local_750;
        iVar3 = (int)yypgoto[""[local_73c] + -0x1f] + (int)*local_e8;
        if (((iVar3 < 0) || (0x112 < iVar3)) ||
           ("\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
            [iVar3] != *local_e8)) {
          cVar1 = ""[""[local_73c] + -0x1f];
        }
        else {
          cVar1 = "\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02"[iVar3];
        }
        in_stack_fffffffffffff864 = CONCAT13(cVar1,(int3)in_stack_fffffffffffff864);
        local_4 = (int)cVar1;
        local_738 = local_738 + (1 - (long)iVar4);
      }
    }
    else {
      if (amrex_parserchar == -2) {
        amrex_parserchar = amrex_parserlex();
      }
      if (0 < amrex_parserchar) {
        if (amrex_parserchar != 0x100) {
          if ((amrex_parserchar < 0) || (0x111 < amrex_parserchar)) {
            in_stack_fffffffffffff874 = 2;
            local_744 = in_stack_fffffffffffff874;
          }
          else {
            in_stack_fffffffffffff874 = (parser_f3_t)""[amrex_parserchar];
            local_744 = in_stack_fffffffffffff874;
          }
          goto LAB_018c9c15;
        }
        amrex_parserchar = 0x101;
        goto LAB_018ca247;
      }
      amrex_parserchar = 0;
      local_744 = PARSER_IF;
LAB_018c9c15:
      iVar4 = local_744 + (int)sVar2;
      if (((iVar4 < 0) || (0x112 < iVar4)) ||
         ((int)"\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
               [iVar4] != local_744)) goto LAB_018c9cc3;
      local_73c = (int)"\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02"[iVar4];
      if (local_73c < 1) {
        local_73c = -local_73c;
        goto LAB_018c9ce8;
      }
      if (local_8 != 0) {
        local_8 = local_8 + -1;
      }
      local_4 = local_73c;
      local_738[1] = amrex_parserlval;
      amrex_parserchar = -2;
      local_738 = local_738 + 1;
    }
    local_e8 = local_e8 + 1;
  } while( true );
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = AMREX_PARSEREMPTY; /* Cause a token to be read.  */
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    goto yyexhaustedlab;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        goto yyexhaustedlab;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          goto yyexhaustedlab;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */

  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == AMREX_PARSEREMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= AMREX_PARSEREOF)
    {
      yychar = AMREX_PARSEREOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == AMREX_PARSERerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = AMREX_PARSERUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = AMREX_PARSEREMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 3: /* input: input exp EOL  */
                {
    amrex::parser_defexpr((yyvsp[-1].n));
  }
    break;

  case 4: /* exp: NUMBER  */
                             { (yyval.n) = amrex::parser_newnumber((yyvsp[0].d)); }
    break;

  case 5: /* exp: SYMBOL  */
                             { (yyval.n) = amrex::parser_newsymbol((yyvsp[0].s)); }
    break;

  case 6: /* exp: exp '+' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_ADD, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 7: /* exp: exp '-' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_SUB, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 8: /* exp: exp '*' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_MUL, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 9: /* exp: exp '/' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_DIV, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 10: /* exp: '(' exp ')'  */
                             { (yyval.n) = (yyvsp[-1].n); }
    break;

  case 11: /* exp: exp '<' exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_LT, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 12: /* exp: exp '>' exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_GT, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 13: /* exp: exp "<=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_LEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 14: /* exp: exp ">=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_GEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 15: /* exp: exp "==" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_EQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 16: /* exp: exp "!=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_NEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 17: /* exp: exp "and" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_AND, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 18: /* exp: exp "or" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_OR, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 19: /* exp: '-' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_NEG, (yyvsp[0].n), nullptr); }
    break;

  case 20: /* exp: '+' exp  */
                             { (yyval.n) = (yyvsp[0].n); }
    break;

  case 21: /* exp: exp "**" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_POW, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 22: /* exp: F1 '(' exp ')'  */
                             { (yyval.n) = amrex::parser_newf1((yyvsp[-3].f1), (yyvsp[-1].n)); }
    break;

  case 23: /* exp: F2 '(' exp ',' exp ')'  */
                             { (yyval.n) = amrex::parser_newf2((yyvsp[-5].f2), (yyvsp[-3].n), (yyvsp[-1].n)); }
    break;

  case 24: /* exp: F3 '(' exp ',' exp ',' exp ')'  */
                                 { (yyval.n) = amrex::parser_newf3((yyvsp[-7].f3), (yyvsp[-5].n), (yyvsp[-3].n), (yyvsp[-1].n)); }
    break;

  case 25: /* exp: SYMBOL '=' exp  */
                             { (yyval.n) = amrex::parser_newassign((yyvsp[-2].s), (yyvsp[0].n)); }
    break;

  case 26: /* exp: exp ';' exp  */
                             { (yyval.n) = amrex::parser_newlist((yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 27: /* exp: exp ';'  */
                             { (yyval.n) = amrex::parser_newlist((yyvsp[-1].n), nullptr); }
    break;



      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == AMREX_PARSEREMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= AMREX_PARSEREOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == AMREX_PARSEREOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = AMREX_PARSEREMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturn;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturn;


#if !defined yyoverflow
/*-------------------------------------------------.
| yyexhaustedlab -- memory exhaustion comes here.  |
`-------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturn;
#endif


/*-------------------------------------------------------.
| yyreturn -- parsing is finished, clean up and return.  |
`-------------------------------------------------------*/
yyreturn:
  if (yychar != AMREX_PARSEREMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}